

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  vfloat<4> vVar2;
  BVH *bvh;
  Geometry *pGVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  byte bVar43;
  int iVar44;
  AABBNodeMB4D *node1;
  ulong uVar45;
  ulong uVar46;
  byte bVar47;
  long lVar48;
  ulong uVar49;
  QuadMesh *mesh;
  uint uVar50;
  NodeRef root;
  size_t sVar51;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  byte bVar55;
  uint uVar56;
  NodeRef *pNVar57;
  undefined4 uVar58;
  ulong uVar59;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar60;
  bool bVar61;
  byte bVar62;
  ulong uVar63;
  ulong uVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vfloat_impl<4> vVar96;
  vfloat_impl<4> vVar97;
  vfloat_impl<4> vVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  vfloat_impl<4> vVar102;
  vfloat_impl<4> vVar103;
  vfloat_impl<4> vVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  float fVar117;
  float fVar118;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar119;
  undefined1 auVar116 [16];
  float fVar120;
  undefined1 auVar121 [16];
  float fVar126;
  undefined1 auVar122 [16];
  float fVar124;
  float fVar125;
  undefined1 auVar123 [64];
  vint4 ai_2;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar136;
  float fVar143;
  float fVar144;
  vint4 ai_3;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar145;
  float fVar146;
  float fVar150;
  float fVar151;
  vint4 bi;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar152;
  undefined1 auVar149 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  vint4 bi_1;
  undefined1 auVar154 [16];
  float fVar157;
  float fVar158;
  float fVar161;
  float fVar162;
  vint4 bi_3;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar163;
  vint4 bi_2;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  float fVar166;
  float fVar169;
  float fVar170;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar172;
  float fVar175;
  float fVar176;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  vint4 ai;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 in_ZMM14 [64];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  uint local_19a8;
  vuint<4> *v;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [8];
  float fStack_17f0;
  float fStack_17ec;
  TravRayK<4,_true> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar65 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar72 = ZEXT816(0) << 0x40;
    uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar72,5);
    uVar63 = vpcmpeqd_avx512vl(auVar65,(undefined1  [16])valid_i->field_0);
    uVar63 = ((byte)uVar10 & 0xf) & uVar63;
    bVar62 = (byte)uVar63;
    if (bVar62 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar190 = ZEXT1664(auVar65);
      auVar66 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar65);
      auVar69._8_4_ = 0x219392ef;
      auVar69._0_8_ = 0x219392ef219392ef;
      auVar69._12_4_ = 0x219392ef;
      uVar45 = vcmpps_avx512vl(auVar66,auVar69,1);
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar191 = ZEXT1664(auVar66);
      auVar67 = vdivps_avx512vl(auVar66,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar68 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar65);
      uVar49 = vcmpps_avx512vl(auVar68,auVar69,1);
      auVar68 = vdivps_avx512vl(auVar66,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar65 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar65);
      uVar11 = vcmpps_avx512vl(auVar65,auVar69,1);
      auVar65 = vdivps_avx512vl(auVar66,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar61 = (bool)((byte)uVar45 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar67._0_4_;
      bVar61 = (bool)((byte)(uVar45 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar67._4_4_;
      bVar61 = (bool)((byte)(uVar45 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar67._8_4_;
      bVar61 = (bool)((byte)(uVar45 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar67._12_4_;
      bVar61 = (bool)((byte)uVar49 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar68._0_4_;
      bVar61 = (bool)((byte)(uVar49 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar68._4_4_;
      bVar61 = (bool)((byte)(uVar49 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar68._8_4_;
      bVar61 = (bool)((byte)(uVar49 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar68._12_4_;
      bVar61 = (bool)((byte)uVar11 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar65._0_4_;
      bVar61 = (bool)((byte)(uVar11 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar65._4_4_;
      bVar61 = (bool)((byte)(uVar11 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar65._8_4_;
      bVar61 = (bool)((byte)(uVar11 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar61 * 0x5d5e0b6b | (uint)!bVar61 * auVar65._12_4_;
      uVar45 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar72,1);
      auVar65 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar45 & 1) * auVar65._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar45 >> 1) & 1) * auVar65._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar45 >> 2) & 1) * auVar65._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar45 >> 3) & 1) * auVar65._12_4_;
      uVar45 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar72,5);
      auVar65 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar61 = (bool)((byte)uVar45 & 1);
      bVar6 = (bool)((byte)(uVar45 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar45 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar45 >> 3) & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar61 * auVar65._0_4_ | (uint)!bVar61 * 0x30;
      tray.nearXYZ.field_0._20_4_ = (uint)bVar6 * auVar65._4_4_ | (uint)!bVar6 * 0x30;
      tray.nearXYZ.field_0._24_4_ = (uint)bVar7 * auVar65._8_4_ | (uint)!bVar7 * 0x30;
      tray.nearXYZ.field_0._28_4_ = (uint)bVar8 * auVar65._12_4_ | (uint)!bVar8 * 0x30;
      uVar45 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar72,5);
      auVar65 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar61 = (bool)((byte)uVar45 & 1);
      bVar6 = (bool)((byte)(uVar45 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar45 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar45 >> 3) & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar61 * auVar65._0_4_ | (uint)!bVar61 * 0x50;
      tray.nearXYZ.field_0._36_4_ = (uint)bVar6 * auVar65._4_4_ | (uint)!bVar6 * 0x50;
      tray.nearXYZ.field_0._40_4_ = (uint)bVar7 * auVar65._8_4_ | (uint)!bVar7 * 0x50;
      tray.nearXYZ.field_0._44_4_ = (uint)bVar8 * auVar65._12_4_ | (uint)!bVar8 * 0x50;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar192 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar65 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar72);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar62 & 1) * auVar65._0_4_ |
           (uint)!(bool)(bVar62 & 1) * stack_near[0].field_0._0_4_;
      bVar61 = (bool)((byte)(uVar63 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar61 * auVar65._4_4_ | (uint)!bVar61 * stack_near[0].field_0._4_4_;
      bVar61 = (bool)((byte)(uVar63 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar61 * auVar65._8_4_ | (uint)!bVar61 * stack_near[0].field_0._8_4_;
      bVar61 = SUB81(uVar63 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar61 * auVar65._12_4_ | (uint)!bVar61 * stack_near[0].field_0._12_4_;
      auVar65 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar72);
      tray.tfar.field_0.i[0] =
           (uint)(bVar62 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar62 & 1) * -0x800000;
      bVar61 = (bool)((byte)(uVar63 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar61 * auVar65._4_4_ | (uint)!bVar61 * -0x800000;
      bVar61 = (bool)((byte)(uVar63 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar61 * auVar65._8_4_ | (uint)!bVar61 * -0x800000;
      bVar61 = SUB81(uVar63 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar61 * auVar65._12_4_ | (uint)!bVar61 * -0x800000;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar56 = 3;
      }
      else {
        uVar56 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      local_19a8 = (ushort)uVar63 ^ 0xf;
      pNVar57 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar60 = &stack_near[2].field_0;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar193 = ZEXT1664(auVar65);
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar194 = ZEXT1664(auVar65);
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
      auVar189 = ZEXT1664(auVar65);
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar188 = ZEXT1664(auVar65);
LAB_006a888b:
      do {
        do {
          root.ptr = pNVar57[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006a9e90;
          pNVar57 = pNVar57 + -1;
          vVar2.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar60[-1].v;
          auVar123 = ZEXT1664((undefined1  [16])vVar2.field_0);
          paVar60 = paVar60 + -1;
          uVar63 = vcmpps_avx512vl((undefined1  [16])vVar2.field_0,
                                   (undefined1  [16])tray.tfar.field_0,1);
        } while ((char)uVar63 == '\0');
        uVar58 = (undefined4)uVar63;
        if (uVar56 < (uint)POPCOUNT(uVar58)) {
LAB_006a88dc:
          do {
            lVar48 = -0x10;
            uVar50 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006a9e90;
              uVar10 = vcmpps_avx512vl(auVar123._0_16_,(undefined1  [16])tray.tfar.field_0,9);
              if ((char)uVar10 != '\0') {
                uVar63 = (ulong)(uVar50 & 0xf);
                bVar43 = (byte)((ulong)local_19a8 & 0xffffffffffffff0f);
                if (uVar63 != 8) {
                  uVar45 = (ulong)local_19a8 & 0xffffffffffffff0f ^ 0xf;
                  uVar49 = 0;
                  do {
                    lVar48 = uVar49 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    bVar43 = (byte)uVar45;
                    uVar11 = 0;
                    for (uVar46 = uVar45; (uVar46 & 1) == 0;
                        uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                      uVar11 = uVar11 + 1;
                    }
                    uVar46 = uVar45;
                    uVar59 = 0;
                    while( true ) {
                      bVar55 = (byte)uVar46;
                      auVar65 = in_ZMM8._0_16_;
                      auVar90 = in_ZMM20._0_16_;
                      auVar72 = in_ZMM14._0_16_;
                      if (*(int *)(lVar48 + 0x50 + uVar59 * 4) == -1) break;
                      pGVar3 = (context->scene->geometries).items
                               [*(uint *)(lVar48 + 0x40 + uVar59 * 4)].ptr;
                      fVar111 = (pGVar3->time_range).lower;
                      auVar91._4_4_ = fVar111;
                      auVar91._0_4_ = fVar111;
                      auVar91._8_4_ = fVar111;
                      auVar91._12_4_ = fVar111;
                      fVar117 = pGVar3->fnumTimeSegments;
                      auVar127._4_4_ = fVar117;
                      auVar127._0_4_ = fVar117;
                      auVar127._8_4_ = fVar117;
                      auVar127._12_4_ = fVar117;
                      auVar67 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar91);
                      fVar111 = (pGVar3->time_range).upper - fVar111;
                      auVar95._4_4_ = fVar111;
                      auVar95._0_4_ = fVar111;
                      auVar95._8_4_ = fVar111;
                      auVar95._12_4_ = fVar111;
                      auVar66 = vdivps_avx(auVar67,auVar95);
                      auVar112._0_4_ = fVar117 * auVar66._0_4_;
                      auVar112._4_4_ = fVar117 * auVar66._4_4_;
                      auVar112._8_4_ = fVar117 * auVar66._8_4_;
                      auVar112._12_4_ = fVar117 * auVar66._12_4_;
                      auVar66 = vroundps_avx(auVar112,1);
                      auVar68 = vaddss_avx512f(auVar127,SUB6416(ZEXT464(0xbf800000),0));
                      auVar128._0_4_ = auVar68._0_4_;
                      auVar128._4_4_ = auVar128._0_4_;
                      auVar128._8_4_ = auVar128._0_4_;
                      auVar128._12_4_ = auVar128._0_4_;
                      auVar66 = vminps_avx(auVar66,auVar128);
                      auVar66 = vmaxps_avx(auVar66,_DAT_01f7aa10);
                      aVar9 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar66);
                      itime.field_0 = aVar9;
                      auVar66 = vsubps_avx(auVar112,auVar66);
                      auVar68 = vpbroadcastd_avx512vl();
                      uVar10 = vpcmpeqd_avx512vl(auVar68,(undefined1  [16])aVar9);
                      auVar68 = auVar191._0_16_;
                      if (((byte)uVar10 & 0xf | ~bVar43 & 0xf) == 0xf) {
                        lVar52 = (long)itime.field_0.i[uVar11] * 0x38;
                        lVar4 = *(long *)(*(long *)&pGVar3[2].numPrimitives + lVar52);
                        lVar52 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 + lVar52);
                        uVar64 = (ulong)*(uint *)(lVar48 + uVar59 * 4);
                        uVar54 = (ulong)*(uint *)(lVar48 + 0x10 + uVar59 * 4);
                        auVar72 = vsubps_avx512vl(auVar68,auVar66);
                        uVar58 = *(undefined4 *)(lVar52 + uVar64 * 4);
                        auVar15._4_4_ = uVar58;
                        auVar15._0_4_ = uVar58;
                        auVar15._8_4_ = uVar58;
                        auVar15._12_4_ = uVar58;
                        auVar65 = vmulps_avx512vl(auVar66,auVar15);
                        uVar58 = *(undefined4 *)(lVar52 + 4 + uVar64 * 4);
                        auVar16._4_4_ = uVar58;
                        auVar16._0_4_ = uVar58;
                        auVar16._8_4_ = uVar58;
                        auVar16._12_4_ = uVar58;
                        auVar67 = vmulps_avx512vl(auVar66,auVar16);
                        uVar58 = *(undefined4 *)(lVar52 + 8 + uVar64 * 4);
                        auVar17._4_4_ = uVar58;
                        auVar17._0_4_ = uVar58;
                        auVar17._8_4_ = uVar58;
                        auVar17._12_4_ = uVar58;
                        auVar69 = vmulps_avx512vl(auVar66,auVar17);
                        uVar58 = *(undefined4 *)(lVar4 + uVar64 * 4);
                        auVar18._4_4_ = uVar58;
                        auVar18._0_4_ = uVar58;
                        auVar18._8_4_ = uVar58;
                        auVar18._12_4_ = uVar58;
                        auVar73 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar18);
                        uVar58 = *(undefined4 *)(lVar4 + 4 + uVar64 * 4);
                        auVar19._4_4_ = uVar58;
                        auVar19._0_4_ = uVar58;
                        auVar19._8_4_ = uVar58;
                        auVar19._12_4_ = uVar58;
                        auVar74 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar19);
                        uVar58 = *(undefined4 *)(lVar4 + 8 + uVar64 * 4);
                        auVar20._4_4_ = uVar58;
                        auVar20._0_4_ = uVar58;
                        auVar20._8_4_ = uVar58;
                        auVar20._12_4_ = uVar58;
                        auVar75 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar20);
                        uVar58 = *(undefined4 *)(lVar52 + uVar54 * 4);
                        auVar21._4_4_ = uVar58;
                        auVar21._0_4_ = uVar58;
                        auVar21._8_4_ = uVar58;
                        auVar21._12_4_ = uVar58;
                        auVar65 = vmulps_avx512vl(auVar66,auVar21);
                        uVar58 = *(undefined4 *)(lVar52 + 4 + uVar54 * 4);
                        auVar22._4_4_ = uVar58;
                        auVar22._0_4_ = uVar58;
                        auVar22._8_4_ = uVar58;
                        auVar22._12_4_ = uVar58;
                        auVar67 = vmulps_avx512vl(auVar66,auVar22);
                        uVar58 = *(undefined4 *)(lVar52 + 8 + uVar54 * 4);
                        auVar23._4_4_ = uVar58;
                        auVar23._0_4_ = uVar58;
                        auVar23._8_4_ = uVar58;
                        auVar23._12_4_ = uVar58;
                        auVar69 = vmulps_avx512vl(auVar66,auVar23);
                        uVar58 = *(undefined4 *)(lVar4 + uVar54 * 4);
                        auVar24._4_4_ = uVar58;
                        auVar24._0_4_ = uVar58;
                        auVar24._8_4_ = uVar58;
                        auVar24._12_4_ = uVar58;
                        auVar76 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar24);
                        uVar58 = *(undefined4 *)(lVar4 + 4 + uVar54 * 4);
                        auVar25._4_4_ = uVar58;
                        auVar25._0_4_ = uVar58;
                        auVar25._8_4_ = uVar58;
                        auVar25._12_4_ = uVar58;
                        auVar77 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar25);
                        uVar58 = *(undefined4 *)(lVar4 + 8 + uVar54 * 4);
                        auVar26._4_4_ = uVar58;
                        auVar26._0_4_ = uVar58;
                        auVar26._8_4_ = uVar58;
                        auVar26._12_4_ = uVar58;
                        auVar78 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar26);
                        uVar64 = (ulong)*(uint *)(lVar48 + 0x20 + uVar59 * 4);
                        uVar58 = *(undefined4 *)(lVar52 + uVar64 * 4);
                        auVar27._4_4_ = uVar58;
                        auVar27._0_4_ = uVar58;
                        auVar27._8_4_ = uVar58;
                        auVar27._12_4_ = uVar58;
                        auVar65 = vmulps_avx512vl(auVar66,auVar27);
                        uVar58 = *(undefined4 *)(lVar52 + 4 + uVar64 * 4);
                        auVar28._4_4_ = uVar58;
                        auVar28._0_4_ = uVar58;
                        auVar28._8_4_ = uVar58;
                        auVar28._12_4_ = uVar58;
                        auVar67 = vmulps_avx512vl(auVar66,auVar28);
                        uVar58 = *(undefined4 *)(lVar52 + 8 + uVar64 * 4);
                        auVar29._4_4_ = uVar58;
                        auVar29._0_4_ = uVar58;
                        auVar29._8_4_ = uVar58;
                        auVar29._12_4_ = uVar58;
                        auVar69 = vmulps_avx512vl(auVar66,auVar29);
                        uVar58 = *(undefined4 *)(lVar4 + uVar64 * 4);
                        auVar30._4_4_ = uVar58;
                        auVar30._0_4_ = uVar58;
                        auVar30._8_4_ = uVar58;
                        auVar30._12_4_ = uVar58;
                        _local_17f8 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar30);
                        uVar58 = *(undefined4 *)(lVar4 + 4 + uVar64 * 4);
                        auVar31._4_4_ = uVar58;
                        auVar31._0_4_ = uVar58;
                        auVar31._8_4_ = uVar58;
                        auVar31._12_4_ = uVar58;
                        local_1808 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar31);
                        uVar58 = *(undefined4 *)(lVar4 + 8 + uVar64 * 4);
                        auVar32._4_4_ = uVar58;
                        auVar32._0_4_ = uVar58;
                        auVar32._8_4_ = uVar58;
                        auVar32._12_4_ = uVar58;
                        local_1818 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar32);
                        uVar64 = (ulong)*(uint *)(lVar48 + 0x30 + uVar59 * 4);
                        uVar58 = *(undefined4 *)(lVar52 + uVar64 * 4);
                        auVar33._4_4_ = uVar58;
                        auVar33._0_4_ = uVar58;
                        auVar33._8_4_ = uVar58;
                        auVar33._12_4_ = uVar58;
                        auVar65 = vmulps_avx512vl(auVar66,auVar33);
                        uVar58 = *(undefined4 *)(lVar52 + 4 + uVar64 * 4);
                        auVar34._4_4_ = uVar58;
                        auVar34._0_4_ = uVar58;
                        auVar34._8_4_ = uVar58;
                        auVar34._12_4_ = uVar58;
                        auVar67 = vmulps_avx512vl(auVar66,auVar34);
                        uVar58 = *(undefined4 *)(lVar52 + 8 + uVar64 * 4);
                        auVar35._4_4_ = uVar58;
                        auVar35._0_4_ = uVar58;
                        auVar35._8_4_ = uVar58;
                        auVar35._12_4_ = uVar58;
                        auVar69 = vmulps_avx512vl(auVar66,auVar35);
                        uVar58 = *(undefined4 *)(lVar4 + uVar64 * 4);
                        auVar36._4_4_ = uVar58;
                        auVar36._0_4_ = uVar58;
                        auVar36._8_4_ = uVar58;
                        auVar36._12_4_ = uVar58;
                        auVar66 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar36);
                        uVar58 = *(undefined4 *)(lVar4 + 4 + uVar64 * 4);
                        auVar37._4_4_ = uVar58;
                        auVar37._0_4_ = uVar58;
                        auVar37._8_4_ = uVar58;
                        auVar37._12_4_ = uVar58;
                        auVar65 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar37);
                        uVar58 = *(undefined4 *)(lVar4 + 8 + uVar64 * 4);
                        auVar38._4_4_ = uVar58;
                        auVar38._0_4_ = uVar58;
                        auVar38._8_4_ = uVar58;
                        auVar38._12_4_ = uVar58;
                        auVar72 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar38);
                      }
                      else {
                        uVar10 = p1.field_0._32_8_;
                        uVar12 = p1.field_0._24_8_;
                        if (bVar43 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar53 = (ulong)*(uint *)(lVar48 + uVar59 * 4);
                          uVar54 = uVar45;
                          uVar64 = uVar11;
                          do {
                            lVar52 = (long)itime.field_0.i[uVar64] * 0x38;
                            auVar67 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar52) + uVar53 * 4)
                            ;
                            auVar69 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar52) + uVar53 * 4);
                            *(int *)((long)&p0.field_0 + uVar64 * 4) = auVar67._0_4_;
                            uVar58 = vextractps_avx(auVar67,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar58;
                            uVar58 = vextractps_avx(auVar67,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar58;
                            *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar69._0_4_;
                            uVar58 = vextractps_avx(auVar69,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar58;
                            uVar58 = vextractps_avx(auVar69,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar58;
                            uVar54 = uVar54 ^ 1L << (uVar64 & 0x3f);
                            uVar64 = 0;
                            for (uVar14 = uVar54; (uVar14 & 1) == 0;
                                uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                              uVar64 = uVar64 + 1;
                            }
                          } while (uVar54 != 0);
                          aVar9.v[1] = p1.field_0._8_8_;
                          aVar9.v[0] = p1.field_0._0_8_;
                          auVar67 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar10 = p1.field_0._32_8_;
                          uVar12 = p1.field_0._24_8_;
                        }
                        p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                        p1.field_0._24_4_ = (undefined4)uVar12;
                        p1.field_0._36_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                        p1.field_0._32_4_ = (undefined4)uVar10;
                        auVar70 = vsubps_avx512vl(auVar68,auVar66);
                        fVar120 = auVar70._0_4_;
                        fVar136 = fVar120 * (float)p0.field_0._16_4_;
                        fVar124 = auVar70._4_4_;
                        fVar143 = fVar124 * (float)p0.field_0._20_4_;
                        fVar125 = auVar70._8_4_;
                        fVar144 = fVar125 * (float)p0.field_0._24_4_;
                        fVar126 = auVar70._12_4_;
                        fVar145 = fVar126 * (float)p0.field_0._28_4_;
                        fVar146 = fVar120 * (float)p0.field_0._32_4_;
                        fVar150 = fVar124 * (float)p0.field_0._36_4_;
                        fVar151 = fVar125 * (float)p0.field_0._40_4_;
                        fVar152 = fVar126 * (float)p0.field_0._44_4_;
                        fVar111 = auVar66._0_4_;
                        fVar153 = fVar111 * (float)p1.field_0._16_4_;
                        fVar117 = auVar66._4_4_;
                        fVar155 = fVar117 * (float)p1.field_0._20_4_;
                        fVar118 = auVar66._8_4_;
                        fVar156 = fVar118 * (float)p1.field_0._24_4_;
                        fVar119 = auVar66._12_4_;
                        fVar157 = fVar119 * (float)p1.field_0._28_4_;
                        fVar158 = fVar111 * (float)p1.field_0._32_4_;
                        fVar161 = fVar117 * (float)p1.field_0._36_4_;
                        fVar162 = fVar118 * (float)p1.field_0._40_4_;
                        fVar163 = fVar119 * (float)p1.field_0._44_4_;
                        auVar69 = in_ZMM9._0_16_;
                        if (bVar43 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar53 = (ulong)*(uint *)(lVar48 + 0x10 + uVar59 * 4);
                          uVar54 = uVar45;
                          uVar64 = uVar11;
                          p1.field_0._32_8_ = uVar10;
                          p1.field_0._24_8_ = uVar12;
                          do {
                            lVar52 = (long)itime.field_0.i[uVar64] * 0x38;
                            auVar65 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar52) + uVar53 * 4)
                            ;
                            auVar69 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar52) + uVar53 * 4);
                            *(int *)((long)&p0.field_0 + uVar64 * 4) = auVar65._0_4_;
                            uVar58 = vextractps_avx(auVar65,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar58;
                            uVar58 = vextractps_avx(auVar65,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar58;
                            *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar69._0_4_;
                            uVar58 = vextractps_avx(auVar69,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar58;
                            uVar58 = vextractps_avx(auVar69,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar58;
                            uVar54 = uVar54 ^ 1L << (uVar64 & 0x3f);
                            uVar64 = 0;
                            for (uVar14 = uVar54; (uVar14 & 1) == 0;
                                uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                              uVar64 = uVar64 + 1;
                            }
                          } while (uVar54 != 0);
                          auVar65._8_8_ = p1.field_0._8_8_;
                          auVar65._0_8_ = p1.field_0._0_8_;
                          auVar69 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar10 = p1.field_0._32_8_;
                          uVar12 = p1.field_0._24_8_;
                        }
                        p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                        p1.field_0._24_4_ = (undefined4)uVar12;
                        p1.field_0._36_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                        p1.field_0._32_4_ = (undefined4)uVar10;
                        fVar166 = fVar120 * (float)p0.field_0._16_4_;
                        fVar169 = fVar124 * (float)p0.field_0._20_4_;
                        fVar170 = fVar125 * (float)p0.field_0._24_4_;
                        fVar171 = fVar126 * (float)p0.field_0._28_4_;
                        fVar172 = fVar120 * (float)p0.field_0._32_4_;
                        fVar175 = fVar124 * (float)p0.field_0._36_4_;
                        fVar176 = fVar125 * (float)p0.field_0._40_4_;
                        fVar177 = fVar126 * (float)p0.field_0._44_4_;
                        fVar178 = fVar111 * (float)p1.field_0._16_4_;
                        fVar179 = fVar117 * (float)p1.field_0._20_4_;
                        fVar180 = fVar118 * (float)p1.field_0._24_4_;
                        fVar181 = fVar119 * (float)p1.field_0._28_4_;
                        fVar182 = fVar111 * (float)p1.field_0._32_4_;
                        fVar183 = fVar117 * (float)p1.field_0._36_4_;
                        fVar184 = fVar118 * (float)p1.field_0._40_4_;
                        fVar185 = fVar119 * (float)p1.field_0._44_4_;
                        auVar71 = in_ZMM15._0_16_;
                        p1.field_0._32_8_ = uVar10;
                        if (bVar43 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar53 = (ulong)*(uint *)(lVar48 + 0x20 + uVar59 * 4);
                          uVar54 = uVar45;
                          uVar64 = uVar11;
                          p1.field_0._24_8_ = uVar12;
                          do {
                            lVar52 = (long)itime.field_0.i[uVar64] * 0x38;
                            auVar72 = *(undefined1 (*) [16])(*(long *)(lVar4 + lVar52) + uVar53 * 4)
                            ;
                            auVar71 = *(undefined1 (*) [16])
                                       (*(long *)(lVar4 + 0x38 + lVar52) + uVar53 * 4);
                            *(int *)((long)&p0.field_0 + uVar64 * 4) = auVar72._0_4_;
                            uVar58 = vextractps_avx(auVar72,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar58;
                            uVar58 = vextractps_avx(auVar72,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar58;
                            *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar71._0_4_;
                            uVar58 = vextractps_avx(auVar71,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar58;
                            uVar58 = vextractps_avx(auVar71,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar58;
                            uVar54 = uVar54 ^ 1L << (uVar64 & 0x3f);
                            uVar64 = 0;
                            for (uVar14 = uVar54; (uVar14 & 1) == 0;
                                uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                              uVar64 = uVar64 + 1;
                            }
                          } while (uVar54 != 0);
                          auVar72._8_8_ = p1.field_0._8_8_;
                          auVar72._0_8_ = p1.field_0._0_8_;
                          auVar71 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar12 = p1.field_0._24_8_;
                        }
                        p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                        p1.field_0._24_4_ = (undefined4)uVar12;
                        auVar94 = vmulps_avx512vl(auVar70,(undefined1  [16])
                                                          p0.field_0.field_0.y.field_0);
                        auVar99 = vmulps_avx512vl(auVar70,(undefined1  [16])
                                                          p0.field_0.field_0.z.field_0);
                        auVar41._4_4_ = p1.field_0._20_4_;
                        auVar41._0_4_ = p1.field_0._16_4_;
                        auVar41._8_4_ = p1.field_0._24_4_;
                        auVar41._12_4_ = p1.field_0._28_4_;
                        auVar108 = vmulps_avx512vl(auVar66,auVar41);
                        auVar42._8_4_ = p1.field_0._40_4_;
                        auVar42._0_8_ = p1.field_0._32_8_;
                        auVar42._12_4_ = p1.field_0._44_4_;
                        auVar100 = vmulps_avx512vl(auVar66,auVar42);
                        auVar101 = (undefined1  [16])in_ZMM21._0_16_;
                        uVar10 = p1.field_0._32_8_;
                        if (bVar43 != 0) {
                          lVar4 = *(long *)&pGVar3[2].numPrimitives;
                          uVar53 = (ulong)*(uint *)(lVar48 + 0x30 + uVar59 * 4);
                          uVar54 = uVar45;
                          uVar64 = uVar11;
                          p1.field_0._24_8_ = uVar12;
                          do {
                            lVar52 = (long)itime.field_0.i[uVar64] * 0x38;
                            auVar101 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                           (*(long *)(lVar4 + lVar52) + uVar53 * 4))
                            ;
                            auVar92 = vmovdqu64_avx512vl(*(undefined1 (*) [16])
                                                          (*(long *)(lVar4 + 0x38 + lVar52) +
                                                          uVar53 * 4));
                            *(int *)((long)&p0.field_0 + uVar64 * 4) = auVar101._0_4_;
                            uVar58 = vextractps_avx512f(auVar101,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x10) = uVar58;
                            uVar58 = vextractps_avx512f(auVar101,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar64 * 4 + 0x20) = uVar58;
                            *(int *)((long)&p1.field_0 + uVar64 * 4) = auVar92._0_4_;
                            uVar58 = vextractps_avx512f(auVar92,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x10) = uVar58;
                            uVar58 = vextractps_avx512f(auVar92,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar64 * 4 + 0x20) = uVar58;
                            uVar54 = uVar54 ^ 1L << (uVar64 & 0x3f);
                            uVar64 = 0;
                            for (uVar14 = uVar54; (uVar14 & 1) == 0;
                                uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                              uVar64 = uVar64 + 1;
                            }
                          } while (uVar54 != 0);
                          auVar90._8_8_ = p1.field_0._8_8_;
                          auVar90._0_8_ = p1.field_0._0_8_;
                          auVar101 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                          uVar10 = p1.field_0._32_8_;
                          uVar12 = p1.field_0._24_8_;
                        }
                        p1.field_0._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
                        p1.field_0._24_4_ = (undefined4)uVar12;
                        p1.field_0._36_4_ = (undefined4)((ulong)uVar10 >> 0x20);
                        p1.field_0._32_4_ = (undefined4)uVar10;
                        auVar73._0_4_ = fVar120 * auVar67._0_4_ + fVar111 * aVar9.i[0];
                        auVar73._4_4_ = fVar124 * auVar67._4_4_ + fVar117 * aVar9.i[1];
                        auVar73._8_4_ = fVar125 * auVar67._8_4_ + fVar118 * aVar9.i[2];
                        auVar73._12_4_ = fVar126 * auVar67._12_4_ + fVar119 * aVar9.i[3];
                        auVar74._0_4_ = fVar136 + fVar153;
                        auVar74._4_4_ = fVar143 + fVar155;
                        auVar74._8_4_ = fVar144 + fVar156;
                        auVar74._12_4_ = fVar145 + fVar157;
                        auVar75._0_4_ = fVar146 + fVar158;
                        auVar75._4_4_ = fVar150 + fVar161;
                        auVar75._8_4_ = fVar151 + fVar162;
                        auVar75._12_4_ = fVar152 + fVar163;
                        auVar76._0_4_ = auVar69._0_4_ * fVar120 + auVar65._0_4_ * fVar111;
                        auVar76._4_4_ = auVar69._4_4_ * fVar124 + auVar65._4_4_ * fVar117;
                        auVar76._8_4_ = auVar69._8_4_ * fVar125 + auVar65._8_4_ * fVar118;
                        auVar76._12_4_ = auVar69._12_4_ * fVar126 + auVar65._12_4_ * fVar119;
                        auVar77._0_4_ = fVar166 + fVar178;
                        auVar77._4_4_ = fVar169 + fVar179;
                        auVar77._8_4_ = fVar170 + fVar180;
                        auVar77._12_4_ = fVar171 + fVar181;
                        auVar78._0_4_ = fVar172 + fVar182;
                        auVar78._4_4_ = fVar175 + fVar183;
                        auVar78._8_4_ = fVar176 + fVar184;
                        auVar78._12_4_ = fVar177 + fVar185;
                        local_17f8._4_4_ = auVar71._4_4_ * fVar124 + auVar72._4_4_ * fVar117;
                        local_17f8._0_4_ = auVar71._0_4_ * fVar120 + auVar72._0_4_ * fVar111;
                        fStack_17f0 = auVar71._8_4_ * fVar125 + auVar72._8_4_ * fVar118;
                        fStack_17ec = auVar71._12_4_ * fVar126 + auVar72._12_4_ * fVar119;
                        local_1808 = vaddps_avx512vl(auVar94,auVar108);
                        local_1818 = vaddps_avx512vl(auVar99,auVar100);
                        auVar65 = vmulps_avx512vl(auVar70,auVar101);
                        auVar149._0_4_ = fVar120 * (float)p0.field_0._16_4_;
                        auVar149._4_4_ = fVar124 * (float)p0.field_0._20_4_;
                        auVar149._8_4_ = fVar125 * (float)p0.field_0._24_4_;
                        auVar149._12_4_ = fVar126 * (float)p0.field_0._28_4_;
                        auVar122._0_4_ = fVar120 * (float)p0.field_0._32_4_;
                        auVar122._4_4_ = fVar124 * (float)p0.field_0._36_4_;
                        auVar122._8_4_ = fVar125 * (float)p0.field_0._40_4_;
                        auVar122._12_4_ = fVar126 * (float)p0.field_0._44_4_;
                        auVar72 = vmulps_avx512vl(auVar66,auVar90);
                        auVar66 = vaddps_avx512vl(auVar65,auVar72);
                        auVar135._0_4_ = fVar111 * (float)p1.field_0._16_4_;
                        auVar135._4_4_ = fVar117 * (float)p1.field_0._20_4_;
                        auVar135._8_4_ = fVar118 * (float)p1.field_0._24_4_;
                        auVar135._12_4_ = fVar119 * (float)p1.field_0._28_4_;
                        auVar65 = vaddps_avx512vl(auVar149,auVar135);
                        auVar116._0_4_ = fVar111 * (float)p1.field_0._32_4_;
                        auVar116._4_4_ = fVar117 * (float)p1.field_0._36_4_;
                        auVar116._8_4_ = fVar118 * (float)p1.field_0._40_4_;
                        auVar116._12_4_ = fVar119 * (float)p1.field_0._44_4_;
                        auVar72 = vaddps_avx512vl(auVar122,auVar116);
                        p1.field_0._32_8_ = uVar10;
                        p1.field_0._24_8_ = uVar12;
                      }
                      auVar67 = *(undefined1 (*) [16])ray;
                      auVar69 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar70 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar71 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar101 = *(undefined1 (*) [16])(ray + 0x50);
                      in_ZMM8 = ZEXT1664(auVar101);
                      auVar94 = *(undefined1 (*) [16])(ray + 0x60);
                      auVar99 = vsubps_avx(auVar73,auVar67);
                      auVar108 = vsubps_avx(auVar74,auVar69);
                      auVar100 = vsubps_avx(auVar75,auVar70);
                      in_ZMM9 = ZEXT1664(auVar100);
                      auVar92 = vsubps_avx(auVar76,auVar67);
                      auVar93 = vsubps_avx(auVar77,auVar69);
                      auVar79 = vsubps_avx512vl(auVar78,auVar70);
                      auVar80 = vsubps_avx512vl(auVar66,auVar67);
                      auVar81 = vsubps_avx512vl(auVar65,auVar69);
                      auVar82 = vsubps_avx512vl(auVar72,auVar70);
                      auVar83 = vsubps_avx512vl(auVar80,auVar99);
                      auVar84 = vsubps_avx512vl(auVar81,auVar108);
                      auVar85 = vsubps_avx512vl(auVar82,auVar100);
                      auVar86 = vsubps_avx512vl(auVar99,auVar92);
                      auVar87 = vsubps_avx512vl(auVar108,auVar93);
                      auVar88 = vsubps_avx512vl(auVar100,auVar79);
                      auVar70 = vaddps_avx512vl(auVar80,auVar99);
                      auVar89 = vaddps_avx512vl(auVar81,auVar108);
                      auVar67 = vaddps_avx512vl(auVar82,auVar100);
                      auVar137._0_4_ = auVar85._0_4_ * auVar89._0_4_;
                      auVar137._4_4_ = auVar85._4_4_ * auVar89._4_4_;
                      auVar137._8_4_ = auVar85._8_4_ * auVar89._8_4_;
                      auVar137._12_4_ = auVar85._12_4_ * auVar89._12_4_;
                      auVar69 = vfmsub231ps_fma(auVar137,auVar84,auVar67);
                      auVar129._0_4_ = auVar83._0_4_ * auVar67._0_4_;
                      auVar129._4_4_ = auVar83._4_4_ * auVar67._4_4_;
                      auVar129._8_4_ = auVar83._8_4_ * auVar67._8_4_;
                      auVar129._12_4_ = auVar83._12_4_ * auVar67._12_4_;
                      auVar67 = vfmsub231ps_fma(auVar129,auVar85,auVar70);
                      auVar113._0_4_ = auVar84._0_4_ * auVar70._0_4_;
                      auVar113._4_4_ = auVar84._4_4_ * auVar70._4_4_;
                      auVar113._8_4_ = auVar84._8_4_ * auVar70._8_4_;
                      auVar113._12_4_ = auVar84._12_4_ * auVar70._12_4_;
                      auVar70 = vfmsub231ps_fma(auVar113,auVar83,auVar89);
                      fVar111 = auVar94._0_4_;
                      auVar114._0_4_ = fVar111 * auVar70._0_4_;
                      fVar117 = auVar94._4_4_;
                      auVar114._4_4_ = fVar117 * auVar70._4_4_;
                      fVar118 = auVar94._8_4_;
                      auVar114._8_4_ = fVar118 * auVar70._8_4_;
                      fVar119 = auVar94._12_4_;
                      auVar114._12_4_ = fVar119 * auVar70._12_4_;
                      auVar67 = vfmadd231ps_fma(auVar114,auVar101,auVar67);
                      auVar67 = vfmadd231ps_fma(auVar67,auVar71,auVar69);
                      auVar121._0_4_ = auVar92._0_4_ + auVar99._0_4_;
                      auVar121._4_4_ = auVar92._4_4_ + auVar99._4_4_;
                      auVar121._8_4_ = auVar92._8_4_ + auVar99._8_4_;
                      auVar121._12_4_ = auVar92._12_4_ + auVar99._12_4_;
                      auVar130._0_4_ = auVar93._0_4_ + auVar108._0_4_;
                      auVar130._4_4_ = auVar93._4_4_ + auVar108._4_4_;
                      auVar130._8_4_ = auVar93._8_4_ + auVar108._8_4_;
                      auVar130._12_4_ = auVar93._12_4_ + auVar108._12_4_;
                      auVar69 = vaddps_avx512vl(auVar100,auVar79);
                      auVar70 = vmulps_avx512vl(auVar130,auVar88);
                      auVar70 = vfmsub231ps_avx512vl(auVar70,auVar87,auVar69);
                      auVar69 = vmulps_avx512vl(auVar69,auVar86);
                      auVar69 = vfmsub231ps_avx512vl(auVar69,auVar88,auVar121);
                      auVar89 = vmulps_avx512vl(auVar121,auVar87);
                      auVar89 = vfmsub231ps_avx512vl(auVar89,auVar86,auVar130);
                      auVar90 = vsubps_avx512vl(auVar92,auVar80);
                      auVar138._0_4_ = fVar111 * auVar89._0_4_;
                      auVar138._4_4_ = fVar117 * auVar89._4_4_;
                      auVar138._8_4_ = fVar118 * auVar89._8_4_;
                      auVar138._12_4_ = fVar119 * auVar89._12_4_;
                      auVar69 = vfmadd231ps_avx512vl(auVar138,auVar101,auVar69);
                      auVar89 = vsubps_avx512vl(auVar93,auVar81);
                      auVar69 = vfmadd231ps_fma(auVar69,auVar71,auVar70);
                      auVar91 = vsubps_avx512vl(auVar79,auVar82);
                      auVar70 = vaddps_avx512vl(auVar92,auVar80);
                      auVar92 = vaddps_avx512vl(auVar93,auVar81);
                      auVar93 = vaddps_avx512vl(auVar79,auVar82);
                      auVar79 = vmulps_avx512vl(auVar92,auVar91);
                      auVar79 = vfmsub231ps_avx512vl(auVar79,auVar89,auVar93);
                      auVar93 = vmulps_avx512vl(auVar93,auVar90);
                      auVar93 = vfmsub231ps_avx512vl(auVar93,auVar91,auVar70);
                      auVar186._0_4_ = auVar70._0_4_ * auVar89._0_4_;
                      auVar186._4_4_ = auVar70._4_4_ * auVar89._4_4_;
                      auVar186._8_4_ = auVar70._8_4_ * auVar89._8_4_;
                      auVar186._12_4_ = auVar70._12_4_ * auVar89._12_4_;
                      auVar70 = vfmsub231ps_fma(auVar186,auVar90,auVar92);
                      auVar70 = vmulps_avx512vl(auVar70,auVar94);
                      auVar70 = vfmadd231ps_avx512vl(auVar70,auVar101,auVar93);
                      auVar70 = vfmadd231ps_avx512vl(auVar70,auVar71,auVar79);
                      in_ZMM21 = ZEXT1664(auVar70);
                      auVar187._0_4_ = auVar67._0_4_ + auVar69._0_4_;
                      auVar187._4_4_ = auVar67._4_4_ + auVar69._4_4_;
                      auVar187._8_4_ = auVar67._8_4_ + auVar69._8_4_;
                      auVar187._12_4_ = auVar67._12_4_ + auVar69._12_4_;
                      auVar94 = vaddps_avx512vl(auVar70,auVar187);
                      in_ZMM14 = ZEXT1664(auVar94);
                      auVar81 = auVar190._0_16_;
                      auVar92 = vandps_avx512vl(auVar94,auVar81);
                      in_ZMM15 = ZEXT1664(auVar92);
                      auVar93 = vmulps_avx512vl(auVar92,auVar189._0_16_);
                      auVar79 = vminps_avx512vl(auVar67,auVar69);
                      auVar79 = vminps_avx512vl(auVar79,auVar70);
                      auVar80 = vxorps_avx512vl(auVar93,auVar188._0_16_);
                      uVar10 = vcmpps_avx512vl(auVar79,auVar80,5);
                      auVar79 = vmaxps_avx512vl(auVar67,auVar69);
                      auVar70 = vmaxps_avx512vl(auVar79,auVar70);
                      in_ZMM20 = ZEXT1664(auVar70);
                      uVar12 = vcmpps_avx512vl(auVar70,auVar93,2);
                      bVar47 = ((byte)uVar10 | (byte)uVar12) & 0xf & bVar55;
                      if (bVar47 != 0) {
                        auVar70 = vmulps_avx512vl(auVar87,auVar85);
                        auVar93 = vmulps_avx512vl(auVar83,auVar88);
                        in_ZMM20 = ZEXT1664(auVar93);
                        auVar79 = vmulps_avx512vl(auVar86,auVar84);
                        in_ZMM21 = ZEXT1664(auVar79);
                        auVar80 = vmulps_avx512vl(auVar89,auVar88);
                        auVar82 = vmulps_avx512vl(auVar86,auVar91);
                        auVar95 = vmulps_avx512vl(auVar90,auVar87);
                        auVar84 = vfmsub213ps_avx512vl(auVar84,auVar88,auVar70);
                        auVar85 = vfmsub213ps_avx512vl(auVar85,auVar86,auVar93);
                        auVar83 = vfmsub213ps_avx512vl(auVar83,auVar87,auVar79);
                        auVar87 = vfmsub213ps_avx512vl(auVar91,auVar87,auVar80);
                        auVar88 = vfmsub213ps_avx512vl(auVar90,auVar88,auVar82);
                        auVar86 = vfmsub213ps_avx512vl(auVar89,auVar86,auVar95);
                        auVar70 = vandps_avx512vl(auVar70,auVar81);
                        auVar80 = vandps_avx512vl(auVar80,auVar81);
                        uVar64 = vcmpps_avx512vl(auVar70,auVar80,1);
                        auVar70 = vandps_avx512vl(auVar93,auVar81);
                        auVar93 = vandps_avx512vl(auVar82,auVar81);
                        uVar54 = vcmpps_avx512vl(auVar70,auVar93,1);
                        auVar70 = vandps_avx512vl(auVar79,auVar81);
                        auVar93 = vandps_avx512vl(auVar95,auVar81);
                        auVar79 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar188 = ZEXT1664(auVar79);
                        uVar53 = vcmpps_avx512vl(auVar70,auVar93,1);
                        bVar61 = (bool)((byte)uVar64 & 1);
                        vVar96.field_0._0_4_ =
                             (uint)bVar61 * auVar84._0_4_ | (uint)!bVar61 * auVar87._0_4_;
                        bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                        vVar96.field_0._4_4_ =
                             (uint)bVar61 * auVar84._4_4_ | (uint)!bVar61 * auVar87._4_4_;
                        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
                        vVar96.field_0._8_4_ =
                             (uint)bVar61 * auVar84._8_4_ | (uint)!bVar61 * auVar87._8_4_;
                        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
                        vVar96.field_0._12_4_ =
                             (uint)bVar61 * auVar84._12_4_ | (uint)!bVar61 * auVar87._12_4_;
                        bVar61 = (bool)((byte)uVar54 & 1);
                        vVar97.field_0._0_4_ =
                             (uint)bVar61 * auVar85._0_4_ | (uint)!bVar61 * auVar88._0_4_;
                        bVar61 = (bool)((byte)(uVar54 >> 1) & 1);
                        vVar97.field_0._4_4_ =
                             (uint)bVar61 * auVar85._4_4_ | (uint)!bVar61 * auVar88._4_4_;
                        bVar61 = (bool)((byte)(uVar54 >> 2) & 1);
                        vVar97.field_0._8_4_ =
                             (uint)bVar61 * auVar85._8_4_ | (uint)!bVar61 * auVar88._8_4_;
                        bVar61 = (bool)((byte)(uVar54 >> 3) & 1);
                        vVar97.field_0._12_4_ =
                             (uint)bVar61 * auVar85._12_4_ | (uint)!bVar61 * auVar88._12_4_;
                        bVar61 = (bool)((byte)uVar53 & 1);
                        vVar98.field_0._0_4_ =
                             (float)((uint)bVar61 * auVar83._0_4_ | (uint)!bVar61 * auVar86._0_4_);
                        bVar61 = (bool)((byte)(uVar53 >> 1) & 1);
                        vVar98.field_0._4_4_ =
                             (float)((uint)bVar61 * auVar83._4_4_ | (uint)!bVar61 * auVar86._4_4_);
                        bVar61 = (bool)((byte)(uVar53 >> 2) & 1);
                        vVar98.field_0._8_4_ =
                             (float)((uint)bVar61 * auVar83._8_4_ | (uint)!bVar61 * auVar86._8_4_);
                        bVar61 = (bool)((byte)(uVar53 >> 3) & 1);
                        vVar98.field_0._12_4_ =
                             (float)((uint)bVar61 * auVar83._12_4_ | (uint)!bVar61 * auVar86._12_4_)
                        ;
                        auVar167._0_4_ = fVar111 * vVar98.field_0._0_4_;
                        auVar167._4_4_ = fVar117 * vVar98.field_0._4_4_;
                        auVar167._8_4_ = fVar118 * vVar98.field_0._8_4_;
                        auVar167._12_4_ = fVar119 * vVar98.field_0._12_4_;
                        auVar70 = vfmadd213ps_fma(auVar101,(undefined1  [16])vVar97.field_0,auVar167
                                                 );
                        auVar70 = vfmadd213ps_fma(auVar71,(undefined1  [16])vVar96.field_0,auVar70);
                        auVar159._0_4_ = auVar70._0_4_ + auVar70._0_4_;
                        auVar159._4_4_ = auVar70._4_4_ + auVar70._4_4_;
                        auVar159._8_4_ = auVar70._8_4_ + auVar70._8_4_;
                        auVar159._12_4_ = auVar70._12_4_ + auVar70._12_4_;
                        auVar164._0_4_ = auVar100._0_4_ * vVar98.field_0._0_4_;
                        auVar164._4_4_ = auVar100._4_4_ * vVar98.field_0._4_4_;
                        auVar164._8_4_ = auVar100._8_4_ * vVar98.field_0._8_4_;
                        auVar164._12_4_ = auVar100._12_4_ * vVar98.field_0._12_4_;
                        auVar70 = vfmadd213ps_fma(auVar108,(undefined1  [16])vVar97.field_0,auVar164
                                                 );
                        auVar101 = vfmadd213ps_fma(auVar99,(undefined1  [16])vVar96.field_0,auVar70)
                        ;
                        auVar70 = vrcp14ps_avx512vl(auVar159);
                        auVar99 = vxorps_avx512vl(auVar159,auVar79);
                        in_ZMM8 = ZEXT1664(auVar99);
                        auVar71 = vfnmadd213ps_avx512vl(auVar70,auVar159,auVar68);
                        auVar71 = vfmadd132ps_fma(auVar71,auVar70,auVar70);
                        in_ZMM9 = ZEXT1664(auVar71);
                        auVar70 = *(undefined1 (*) [16])(ray + 0x80);
                        auVar131._0_4_ = auVar71._0_4_ * (auVar101._0_4_ + auVar101._0_4_);
                        auVar131._4_4_ = auVar71._4_4_ * (auVar101._4_4_ + auVar101._4_4_);
                        auVar131._8_4_ = auVar71._8_4_ * (auVar101._8_4_ + auVar101._8_4_);
                        auVar131._12_4_ = auVar71._12_4_ * (auVar101._12_4_ + auVar101._12_4_);
                        uVar10 = vcmpps_avx512vl(auVar131,auVar70,2);
                        uVar12 = vcmpps_avx512vl(auVar131,*(undefined1 (*) [16])(ray + 0x30),0xd);
                        uVar13 = vcmpps_avx512vl(auVar159,auVar99,4);
                        bVar47 = bVar47 & (byte)uVar10 & (byte)uVar12 & (byte)uVar13;
                        if (bVar47 != 0) {
                          uVar50 = pGVar3->mask;
                          auVar147._4_4_ = uVar50;
                          auVar147._0_4_ = uVar50;
                          auVar147._8_4_ = uVar50;
                          auVar147._12_4_ = uVar50;
                          uVar10 = vptestmd_avx512vl(auVar147,*(undefined1 (*) [16])(ray + 0x90));
                          bVar47 = bVar47 & (byte)uVar10 & 0xf;
                          uVar64 = (ulong)bVar47;
                          if (bVar47 != 0) {
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar40._8_4_ = 0x219392ef;
                              auVar40._0_8_ = 0x219392ef219392ef;
                              auVar40._12_4_ = 0x219392ef;
                              uVar46 = vcmpps_avx512vl(auVar92,auVar40,5);
                              auVar101 = vrcp14ps_avx512vl(auVar94);
                              auVar94 = vfnmadd213ps_avx512vl(auVar94,auVar101,auVar68);
                              auVar101 = vfmadd132ps_avx512vl(auVar94,auVar101,auVar101);
                              fVar119 = (float)((uint)((byte)uVar46 & 1) * auVar101._0_4_);
                              fVar118 = (float)((uint)((byte)(uVar46 >> 1) & 1) * auVar101._4_4_);
                              auVar105._4_4_ = fVar118;
                              auVar105._0_4_ = fVar119;
                              fVar117 = (float)((uint)((byte)(uVar46 >> 2) & 1) * auVar101._8_4_);
                              auVar105._8_4_ = fVar117;
                              fVar111 = (float)((uint)((byte)(uVar46 >> 3) & 1) * auVar101._12_4_);
                              auVar105._12_4_ = fVar111;
                              in_ZMM14 = ZEXT1664(auVar105);
                              auVar115._0_4_ = fVar119 * auVar67._0_4_;
                              auVar115._4_4_ = fVar118 * auVar67._4_4_;
                              auVar115._8_4_ = fVar117 * auVar67._8_4_;
                              auVar115._12_4_ = fVar111 * auVar67._12_4_;
                              auVar67 = vminps_avx512vl(auVar115,auVar68);
                              auVar141._0_4_ = fVar119 * auVar69._0_4_;
                              auVar141._4_4_ = fVar118 * auVar69._4_4_;
                              auVar141._8_4_ = fVar117 * auVar69._8_4_;
                              auVar141._12_4_ = fVar111 * auVar69._12_4_;
                              vminps_avx512vl(auVar141,auVar68);
                              vpbroadcastd_avx512vl();
                              vpbroadcastd_avx512vl();
                              p0.field_0.field_0.x.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar96.field_0;
                              p0.field_0.field_0.y.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar97.field_0;
                              p0.field_0.field_0.z.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar98.field_0;
                              vpcmpeqd_avx2(ZEXT1632(auVar67),ZEXT1632(auVar67));
                              uVar50 = context->user->instPrimID[0];
                              auVar67 = vblendmps_avx512vl(auVar70,auVar131);
                              bVar61 = (bool)(bVar47 >> 1 & 1);
                              bVar6 = (bool)(bVar47 >> 2 & 1);
                              *(uint *)(ray + 0x80) =
                                   (uint)(bVar47 & 1) * auVar67._0_4_ | !(bool)(bVar47 & 1) * uVar50
                              ;
                              *(uint *)(ray + 0x84) =
                                   (uint)bVar61 * auVar67._4_4_ | !bVar61 * uVar50;
                              *(uint *)(ray + 0x88) = (uint)bVar6 * auVar67._8_4_ | !bVar6 * uVar50;
                              *(uint *)(ray + 0x8c) =
                                   (uint)(bVar47 >> 3) * auVar67._12_4_ |
                                   !(bool)(bVar47 >> 3) * uVar50;
                              itime.field_0 =
                                   (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vpmovm2d_avx512vl((ulong)bVar47);
                              p1.field_0._0_8_ = &itime;
                              p1.field_0._8_8_ = pGVar3->userPtr;
                              p1.field_0._16_4_ = SUB84(context->user,0);
                              p1.field_0._20_4_ = (undefined4)((ulong)context->user >> 0x20);
                              p1.field_0._32_4_ = SUB84(&p0,0);
                              p1.field_0._36_4_ = (undefined4)((ulong)&p0 >> 0x20);
                              p1.field_0._40_4_ = 4;
                              p1.field_0._32_8_ = &p0;
                              p1.field_0._24_8_ = ray;
                              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                in_ZMM8 = ZEXT1664(auVar99);
                                in_ZMM9 = ZEXT1664(auVar71);
                                in_ZMM14 = ZEXT1664(auVar105);
                                in_ZMM15 = ZEXT1664(auVar92);
                                (*pGVar3->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar188 = ZEXT1664(auVar67);
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                auVar189 = ZEXT1664(auVar67);
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                auVar194 = ZEXT1664(auVar67);
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                auVar193 = ZEXT1664(auVar67);
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar192 = ZEXT1664(auVar67);
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar191 = ZEXT1664(auVar67);
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar190 = ZEXT1664(auVar67);
                              }
                              uVar46 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                         (undefined1  [16])itime.field_0);
                              if ((uVar46 & 0xf) == 0) {
                                uVar64 = 0;
                              }
                              else {
                                p_Var5 = context->args->filter;
                                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                  in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                  (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar188 = ZEXT1664(auVar67);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                  auVar189 = ZEXT1664(auVar67);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                  auVar194 = ZEXT1664(auVar67);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                  auVar193 = ZEXT1664(auVar67);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar192 = ZEXT1664(auVar67);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar191 = ZEXT1664(auVar67);
                                  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar190 = ZEXT1664(auVar67);
                                }
                                uVar64 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                           (undefined1  [16])itime.field_0);
                                uVar64 = uVar64 & 0xf;
                                auVar67 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar61 = (bool)((byte)uVar64 & 1);
                                auVar106._0_4_ =
                                     (uint)bVar61 * auVar67._0_4_ |
                                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x80);
                                bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                                auVar106._4_4_ =
                                     (uint)bVar61 * auVar67._4_4_ |
                                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x84);
                                bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
                                auVar106._8_4_ =
                                     (uint)bVar61 * auVar67._8_4_ |
                                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x88);
                                bVar61 = SUB81(uVar64 >> 3,0);
                                auVar106._12_4_ =
                                     (uint)bVar61 * auVar67._12_4_ |
                                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x8c);
                                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar106;
                              }
                              bVar61 = (bool)((byte)uVar64 & 1);
                              auVar109._0_4_ =
                                   (uint)bVar61 * *(int *)pRVar1 | (uint)!bVar61 * auVar70._0_4_;
                              bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                              auVar109._4_4_ =
                                   (uint)bVar61 * *(int *)(ray + 0x84) |
                                   (uint)!bVar61 * auVar70._4_4_;
                              bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
                              auVar109._8_4_ =
                                   (uint)bVar61 * *(int *)(ray + 0x88) |
                                   (uint)!bVar61 * auVar70._8_4_;
                              bVar61 = SUB81(uVar64 >> 3,0);
                              auVar109._12_4_ =
                                   (uint)bVar61 * *(int *)(ray + 0x8c) |
                                   (uint)!bVar61 * auVar70._12_4_;
                              *(undefined1 (*) [16])pRVar1 = auVar109;
                            }
                            uVar46 = (ulong)(((byte)uVar64 ^ 0xf) & bVar55);
                          }
                        }
                      }
                      bVar55 = (byte)uVar46;
                      if (bVar55 == 0) {
                        bVar55 = 0;
                        break;
                      }
                      auVar67 = *(undefined1 (*) [16])ray;
                      auVar68 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar69 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar70 = *(undefined1 (*) [16])(ray + 0x40);
                      auVar71 = *(undefined1 (*) [16])(ray + 0x50);
                      in_ZMM8 = ZEXT1664(auVar71);
                      auVar101 = *(undefined1 (*) [16])(ray + 0x60);
                      auVar94 = vsubps_avx(_local_17f8,auVar67);
                      auVar99 = vsubps_avx(local_1808,auVar68);
                      auVar108 = vsubps_avx(local_1818,auVar69);
                      in_ZMM9 = ZEXT1664(auVar108);
                      auVar66 = vsubps_avx(auVar66,auVar67);
                      auVar65 = vsubps_avx(auVar65,auVar68);
                      auVar100 = vsubps_avx512vl(auVar72,auVar69);
                      auVar67 = vsubps_avx512vl(auVar76,auVar67);
                      auVar68 = vsubps_avx512vl(auVar77,auVar68);
                      auVar69 = vsubps_avx512vl(auVar78,auVar69);
                      auVar92 = vsubps_avx512vl(auVar67,auVar94);
                      auVar93 = vsubps_avx512vl(auVar68,auVar99);
                      in_ZMM14 = ZEXT1664(auVar93);
                      auVar79 = vsubps_avx512vl(auVar69,auVar108);
                      auVar80 = vsubps_avx512vl(auVar94,auVar66);
                      auVar81 = vsubps_avx512vl(auVar99,auVar65);
                      auVar82 = vsubps_avx512vl(auVar108,auVar100);
                      auVar83 = vsubps_avx512vl(auVar66,auVar67);
                      auVar84 = vsubps_avx512vl(auVar65,auVar68);
                      auVar85 = vsubps_avx512vl(auVar100,auVar69);
                      auVar72 = vaddps_avx512vl(auVar67,auVar94);
                      auVar86 = vaddps_avx512vl(auVar68,auVar99);
                      auVar87 = vaddps_avx512vl(auVar69,auVar108);
                      auVar88 = vmulps_avx512vl(auVar86,auVar79);
                      auVar88 = vfmsub231ps_avx512vl(auVar88,auVar93,auVar87);
                      auVar87 = vmulps_avx512vl(auVar87,auVar92);
                      auVar87 = vfmsub231ps_avx512vl(auVar87,auVar79,auVar72);
                      auVar132._0_4_ = auVar93._0_4_ * auVar72._0_4_;
                      auVar132._4_4_ = auVar93._4_4_ * auVar72._4_4_;
                      auVar132._8_4_ = auVar93._8_4_ * auVar72._8_4_;
                      auVar132._12_4_ = auVar93._12_4_ * auVar72._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar132,auVar92,auVar86);
                      fVar111 = auVar101._0_4_;
                      auVar133._0_4_ = fVar111 * auVar72._0_4_;
                      fVar117 = auVar101._4_4_;
                      auVar133._4_4_ = fVar117 * auVar72._4_4_;
                      fVar118 = auVar101._8_4_;
                      auVar133._8_4_ = fVar118 * auVar72._8_4_;
                      fVar119 = auVar101._12_4_;
                      auVar133._12_4_ = fVar119 * auVar72._12_4_;
                      auVar72 = vfmadd231ps_avx512vl(auVar133,auVar71,auVar87);
                      auVar72 = vfmadd231ps_avx512vl(auVar72,auVar70,auVar88);
                      auVar139._0_4_ = auVar66._0_4_ + auVar94._0_4_;
                      auVar139._4_4_ = auVar66._4_4_ + auVar94._4_4_;
                      auVar139._8_4_ = auVar66._8_4_ + auVar94._8_4_;
                      auVar139._12_4_ = auVar66._12_4_ + auVar94._12_4_;
                      auVar86 = vaddps_avx512vl(auVar99,auVar65);
                      auVar87 = vaddps_avx512vl(auVar108,auVar100);
                      auVar88 = vmulps_avx512vl(auVar86,auVar82);
                      auVar88 = vfmsub231ps_avx512vl(auVar88,auVar81,auVar87);
                      auVar87 = vmulps_avx512vl(auVar87,auVar80);
                      auVar87 = vfmsub231ps_avx512vl(auVar87,auVar82,auVar139);
                      auVar89 = vmulps_avx512vl(auVar139,auVar81);
                      auVar86 = vfmsub231ps_avx512vl(auVar89,auVar80,auVar86);
                      auVar140._0_4_ = fVar111 * auVar86._0_4_;
                      auVar140._4_4_ = fVar117 * auVar86._4_4_;
                      auVar140._8_4_ = fVar118 * auVar86._8_4_;
                      auVar140._12_4_ = fVar119 * auVar86._12_4_;
                      auVar86 = vfmadd231ps_avx512vl(auVar140,auVar71,auVar87);
                      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar188 = ZEXT1664(auVar87);
                      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar70,auVar88);
                      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                      auVar189 = ZEXT1664(auVar88);
                      auVar66 = vaddps_avx512vl(auVar66,auVar67);
                      auVar65 = vaddps_avx512vl(auVar65,auVar68);
                      auVar67 = vaddps_avx512vl(auVar100,auVar69);
                      auVar68 = vmulps_avx512vl(auVar65,auVar85);
                      auVar68 = vfmsub231ps_avx512vl(auVar68,auVar84,auVar67);
                      auVar67 = vmulps_avx512vl(auVar67,auVar83);
                      auVar67 = vfmsub231ps_avx512vl(auVar67,auVar85,auVar66);
                      auVar173._0_4_ = auVar66._0_4_ * auVar84._0_4_;
                      auVar173._4_4_ = auVar66._4_4_ * auVar84._4_4_;
                      auVar173._8_4_ = auVar66._8_4_ * auVar84._8_4_;
                      auVar173._12_4_ = auVar66._12_4_ * auVar84._12_4_;
                      auVar65 = vfmsub231ps_fma(auVar173,auVar83,auVar65);
                      auVar65 = vmulps_avx512vl(auVar65,auVar101);
                      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar71,auVar67);
                      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar70,auVar68);
                      in_ZMM21 = ZEXT1664(auVar65);
                      auVar174._0_4_ = auVar72._0_4_ + auVar86._0_4_;
                      auVar174._4_4_ = auVar72._4_4_ + auVar86._4_4_;
                      auVar174._8_4_ = auVar72._8_4_ + auVar86._8_4_;
                      auVar174._12_4_ = auVar72._12_4_ + auVar86._12_4_;
                      auVar66 = vaddps_avx512vl(auVar65,auVar174);
                      auVar100 = auVar190._0_16_;
                      auVar67 = vandps_avx512vl(auVar66,auVar100);
                      in_ZMM15 = ZEXT1664(auVar67);
                      auVar68 = vmulps_avx512vl(auVar67,auVar88);
                      auVar69 = vminps_avx512vl(auVar72,auVar86);
                      auVar69 = vminps_avx512vl(auVar69,auVar65);
                      auVar101 = vxorps_avx512vl(auVar68,auVar87);
                      uVar10 = vcmpps_avx512vl(auVar69,auVar101,5);
                      auVar69 = vmaxps_avx512vl(auVar72,auVar86);
                      auVar65 = vmaxps_avx512vl(auVar69,auVar65);
                      in_ZMM20 = ZEXT1664(auVar65);
                      uVar12 = vcmpps_avx512vl(auVar65,auVar68,2);
                      bVar47 = ((byte)uVar10 | (byte)uVar12) & 0xf & bVar55;
                      if (bVar47 != 0) {
                        auVar65 = vmulps_avx512vl(auVar81,auVar79);
                        auVar68 = vmulps_avx512vl(auVar92,auVar82);
                        in_ZMM20 = ZEXT1664(auVar68);
                        auVar69 = vmulps_avx512vl(auVar80,auVar93);
                        in_ZMM21 = ZEXT1664(auVar69);
                        auVar101 = vmulps_avx512vl(auVar84,auVar82);
                        auVar87 = vmulps_avx512vl(auVar80,auVar85);
                        auVar88 = vmulps_avx512vl(auVar83,auVar81);
                        auVar93 = vfmsub213ps_avx512vl(auVar93,auVar82,auVar65);
                        in_ZMM14 = ZEXT1664(auVar93);
                        auVar79 = vfmsub213ps_avx512vl(auVar79,auVar80,auVar68);
                        auVar92 = vfmsub213ps_avx512vl(auVar92,auVar81,auVar69);
                        auVar81 = vfmsub213ps_avx512vl(auVar85,auVar81,auVar101);
                        auVar82 = vfmsub213ps_avx512vl(auVar83,auVar82,auVar87);
                        auVar80 = vfmsub213ps_avx512vl(auVar84,auVar80,auVar88);
                        auVar65 = vandps_avx512vl(auVar65,auVar100);
                        auVar101 = vandps_avx512vl(auVar101,auVar100);
                        uVar64 = vcmpps_avx512vl(auVar65,auVar101,1);
                        auVar65 = vandps_avx512vl(auVar68,auVar100);
                        auVar68 = vandps_avx512vl(auVar87,auVar100);
                        uVar54 = vcmpps_avx512vl(auVar65,auVar68,1);
                        auVar65 = vandps_avx512vl(auVar69,auVar100);
                        auVar68 = vandps_avx512vl(auVar88,auVar100);
                        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar188 = ZEXT1664(auVar101);
                        uVar53 = vcmpps_avx512vl(auVar65,auVar68,1);
                        bVar61 = (bool)((byte)uVar64 & 1);
                        vVar102.field_0._0_4_ =
                             (uint)bVar61 * auVar93._0_4_ | (uint)!bVar61 * auVar81._0_4_;
                        bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                        vVar102.field_0._4_4_ =
                             (uint)bVar61 * auVar93._4_4_ | (uint)!bVar61 * auVar81._4_4_;
                        bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
                        vVar102.field_0._8_4_ =
                             (uint)bVar61 * auVar93._8_4_ | (uint)!bVar61 * auVar81._8_4_;
                        bVar61 = (bool)((byte)(uVar64 >> 3) & 1);
                        vVar102.field_0._12_4_ =
                             (uint)bVar61 * auVar93._12_4_ | (uint)!bVar61 * auVar81._12_4_;
                        bVar61 = (bool)((byte)uVar54 & 1);
                        vVar103.field_0._0_4_ =
                             (uint)bVar61 * auVar79._0_4_ | (uint)!bVar61 * auVar82._0_4_;
                        bVar61 = (bool)((byte)(uVar54 >> 1) & 1);
                        vVar103.field_0._4_4_ =
                             (uint)bVar61 * auVar79._4_4_ | (uint)!bVar61 * auVar82._4_4_;
                        bVar61 = (bool)((byte)(uVar54 >> 2) & 1);
                        vVar103.field_0._8_4_ =
                             (uint)bVar61 * auVar79._8_4_ | (uint)!bVar61 * auVar82._8_4_;
                        bVar61 = (bool)((byte)(uVar54 >> 3) & 1);
                        vVar103.field_0._12_4_ =
                             (uint)bVar61 * auVar79._12_4_ | (uint)!bVar61 * auVar82._12_4_;
                        bVar61 = (bool)((byte)uVar53 & 1);
                        vVar104.field_0._0_4_ =
                             (float)((uint)bVar61 * auVar92._0_4_ | (uint)!bVar61 * auVar80._0_4_);
                        bVar61 = (bool)((byte)(uVar53 >> 1) & 1);
                        vVar104.field_0._4_4_ =
                             (float)((uint)bVar61 * auVar92._4_4_ | (uint)!bVar61 * auVar80._4_4_);
                        bVar61 = (bool)((byte)(uVar53 >> 2) & 1);
                        vVar104.field_0._8_4_ =
                             (float)((uint)bVar61 * auVar92._8_4_ | (uint)!bVar61 * auVar80._8_4_);
                        bVar61 = (bool)((byte)(uVar53 >> 3) & 1);
                        vVar104.field_0._12_4_ =
                             (float)((uint)bVar61 * auVar92._12_4_ | (uint)!bVar61 * auVar80._12_4_)
                        ;
                        auVar168._0_4_ = fVar111 * vVar104.field_0._0_4_;
                        auVar168._4_4_ = fVar117 * vVar104.field_0._4_4_;
                        auVar168._8_4_ = fVar118 * vVar104.field_0._8_4_;
                        auVar168._12_4_ = fVar119 * vVar104.field_0._12_4_;
                        auVar65 = vfmadd213ps_fma(auVar71,(undefined1  [16])vVar103.field_0,auVar168
                                                 );
                        auVar65 = vfmadd213ps_fma(auVar70,(undefined1  [16])vVar102.field_0,auVar65)
                        ;
                        auVar160._0_4_ = auVar65._0_4_ + auVar65._0_4_;
                        auVar160._4_4_ = auVar65._4_4_ + auVar65._4_4_;
                        auVar160._8_4_ = auVar65._8_4_ + auVar65._8_4_;
                        auVar160._12_4_ = auVar65._12_4_ + auVar65._12_4_;
                        auVar165._0_4_ = auVar108._0_4_ * vVar104.field_0._0_4_;
                        auVar165._4_4_ = auVar108._4_4_ * vVar104.field_0._4_4_;
                        auVar165._8_4_ = auVar108._8_4_ * vVar104.field_0._8_4_;
                        auVar165._12_4_ = auVar108._12_4_ * vVar104.field_0._12_4_;
                        auVar65 = vfmadd213ps_fma(auVar99,(undefined1  [16])vVar103.field_0,auVar165
                                                 );
                        auVar69 = vfmadd213ps_fma(auVar94,(undefined1  [16])vVar102.field_0,auVar65)
                        ;
                        auVar65 = vrcp14ps_avx512vl(auVar160);
                        auVar70 = vxorps_avx512vl(auVar160,auVar101);
                        in_ZMM8 = ZEXT1664(auVar70);
                        auVar71 = auVar191._0_16_;
                        auVar68 = vfnmadd213ps_avx512vl(auVar65,auVar160,auVar71);
                        auVar68 = vfmadd132ps_fma(auVar68,auVar65,auVar65);
                        in_ZMM9 = ZEXT1664(auVar68);
                        auVar65 = *(undefined1 (*) [16])(ray + 0x80);
                        auVar148._0_4_ = auVar68._0_4_ * (auVar69._0_4_ + auVar69._0_4_);
                        auVar148._4_4_ = auVar68._4_4_ * (auVar69._4_4_ + auVar69._4_4_);
                        auVar148._8_4_ = auVar68._8_4_ * (auVar69._8_4_ + auVar69._8_4_);
                        auVar148._12_4_ = auVar68._12_4_ * (auVar69._12_4_ + auVar69._12_4_);
                        uVar10 = vcmpps_avx512vl(auVar148,auVar65,2);
                        uVar12 = vcmpps_avx512vl(auVar148,*(undefined1 (*) [16])(ray + 0x30),0xd);
                        uVar13 = vcmpps_avx512vl(auVar160,auVar70,4);
                        bVar47 = bVar47 & (byte)uVar10 & (byte)uVar12 & (byte)uVar13;
                        if (bVar47 != 0) {
                          pGVar3 = (context->scene->geometries).items
                                   [*(uint *)(lVar48 + 0x40 + uVar59 * 4)].ptr;
                          uVar50 = pGVar3->mask;
                          auVar154._4_4_ = uVar50;
                          auVar154._0_4_ = uVar50;
                          auVar154._8_4_ = uVar50;
                          auVar154._12_4_ = uVar50;
                          uVar10 = vptestmd_avx512vl(auVar154,*(undefined1 (*) [16])(ray + 0x90));
                          bVar47 = bVar47 & (byte)uVar10 & 0xf;
                          uVar64 = (ulong)bVar47;
                          if (bVar47 != 0) {
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar39._8_4_ = 0x219392ef;
                              auVar39._0_8_ = 0x219392ef219392ef;
                              auVar39._12_4_ = 0x219392ef;
                              uVar46 = vcmpps_avx512vl(auVar67,auVar39,5);
                              auVar69 = vrcp14ps_avx512vl(auVar66);
                              auVar66 = vfnmadd213ps_avx512vl(auVar66,auVar69,auVar71);
                              auVar66 = vfmadd132ps_avx512vl(auVar66,auVar69,auVar69);
                              fVar119 = (float)((uint)((byte)uVar46 & 1) * auVar66._0_4_);
                              fVar118 = (float)((uint)((byte)(uVar46 >> 1) & 1) * auVar66._4_4_);
                              fVar117 = (float)((uint)((byte)(uVar46 >> 2) & 1) * auVar66._8_4_);
                              fVar111 = (float)((uint)((byte)(uVar46 >> 3) & 1) * auVar66._12_4_);
                              auVar134._0_4_ = fVar119 * auVar72._0_4_;
                              auVar134._4_4_ = fVar118 * auVar72._4_4_;
                              auVar134._8_4_ = fVar117 * auVar72._8_4_;
                              auVar134._12_4_ = fVar111 * auVar72._12_4_;
                              auVar72 = vminps_avx512vl(auVar134,auVar71);
                              auVar142._0_4_ = fVar119 * auVar86._0_4_;
                              auVar142._4_4_ = fVar118 * auVar86._4_4_;
                              auVar142._8_4_ = fVar117 * auVar86._8_4_;
                              auVar142._12_4_ = fVar111 * auVar86._12_4_;
                              auVar66 = vminps_avx512vl(auVar142,auVar71);
                              vsubps_avx512vl(auVar71,auVar72);
                              vsubps_avx512vl(auVar71,auVar66);
                              vpbroadcastd_avx512vl();
                              vpbroadcastd_avx512vl();
                              p0.field_0.field_0.x.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar102.field_0;
                              p0.field_0.field_0.y.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar103.field_0;
                              p0.field_0.field_0.z.field_0 =
                                   (vfloat_impl<4>)(vfloat_impl<4>)vVar104.field_0;
                              vpcmpeqd_avx2(ZEXT1632((undefined1  [16])vVar103.field_0),
                                            ZEXT1632((undefined1  [16])vVar103.field_0));
                              uVar50 = context->user->instPrimID[0];
                              auVar72 = vblendmps_avx512vl(auVar65,auVar148);
                              bVar61 = (bool)(bVar47 >> 1 & 1);
                              bVar6 = (bool)(bVar47 >> 2 & 1);
                              *(uint *)(ray + 0x80) =
                                   (uint)(bVar47 & 1) * auVar72._0_4_ | !(bool)(bVar47 & 1) * uVar50
                              ;
                              *(uint *)(ray + 0x84) =
                                   (uint)bVar61 * auVar72._4_4_ | !bVar61 * uVar50;
                              *(uint *)(ray + 0x88) = (uint)bVar6 * auVar72._8_4_ | !bVar6 * uVar50;
                              *(uint *)(ray + 0x8c) =
                                   (uint)(bVar47 >> 3) * auVar72._12_4_ |
                                   !(bool)(bVar47 >> 3) * uVar50;
                              itime.field_0 =
                                   (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vpmovm2d_avx512vl(uVar64);
                              p1.field_0._0_8_ = &itime;
                              p1.field_0._8_8_ = pGVar3->userPtr;
                              p1.field_0._16_4_ = SUB84(context->user,0);
                              p1.field_0._20_4_ = (undefined4)((ulong)context->user >> 0x20);
                              p1.field_0._32_4_ = SUB84(&p0,0);
                              p1.field_0._36_4_ = (undefined4)((ulong)&p0 >> 0x20);
                              p1.field_0._40_4_ = 4;
                              p1.field_0._32_8_ = &p0;
                              p1.field_0._24_8_ = ray;
                              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                in_ZMM8 = ZEXT1664(auVar70);
                                in_ZMM9 = ZEXT1664(auVar68);
                                in_ZMM14 = ZEXT1664(auVar93);
                                in_ZMM15 = ZEXT1664(auVar67);
                                (*pGVar3->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                                auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar188 = ZEXT1664(auVar72);
                                auVar72 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                auVar189 = ZEXT1664(auVar72);
                                auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                auVar194 = ZEXT1664(auVar72);
                                auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                auVar193 = ZEXT1664(auVar72);
                                auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                auVar192 = ZEXT1664(auVar72);
                                auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar191 = ZEXT1664(auVar72);
                                auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar190 = ZEXT1664(auVar72);
                              }
                              uVar46 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                         (undefined1  [16])itime.field_0);
                              if ((uVar46 & 0xf) == 0) {
                                uVar64 = 0;
                              }
                              else {
                                p_Var5 = context->args->filter;
                                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                                  in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                                  in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                  (*p_Var5)((RTCFilterFunctionNArguments *)&p1);
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar188 = ZEXT1664(auVar72);
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                                  auVar189 = ZEXT1664(auVar72);
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                                  auVar194 = ZEXT1664(auVar72);
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                                  auVar193 = ZEXT1664(auVar72);
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                                  auVar192 = ZEXT1664(auVar72);
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar191 = ZEXT1664(auVar72);
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar190 = ZEXT1664(auVar72);
                                }
                                uVar64 = vptestmd_avx512vl((undefined1  [16])itime.field_0,
                                                           (undefined1  [16])itime.field_0);
                                uVar64 = uVar64 & 0xf;
                                auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar61 = (bool)((byte)uVar64 & 1);
                                auVar107._0_4_ =
                                     (uint)bVar61 * auVar72._0_4_ |
                                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x80);
                                bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                                auVar107._4_4_ =
                                     (uint)bVar61 * auVar72._4_4_ |
                                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x84);
                                bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
                                auVar107._8_4_ =
                                     (uint)bVar61 * auVar72._8_4_ |
                                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x88);
                                bVar61 = SUB81(uVar64 >> 3,0);
                                auVar107._12_4_ =
                                     (uint)bVar61 * auVar72._12_4_ |
                                     (uint)!bVar61 * *(int *)(p1.field_0._24_8_ + 0x8c);
                                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar107;
                              }
                              bVar61 = (bool)((byte)uVar64 & 1);
                              auVar110._0_4_ =
                                   (uint)bVar61 * *(int *)pRVar1 | (uint)!bVar61 * auVar65._0_4_;
                              bVar61 = (bool)((byte)(uVar64 >> 1) & 1);
                              auVar110._4_4_ =
                                   (uint)bVar61 * *(int *)(ray + 0x84) |
                                   (uint)!bVar61 * auVar65._4_4_;
                              bVar61 = (bool)((byte)(uVar64 >> 2) & 1);
                              auVar110._8_4_ =
                                   (uint)bVar61 * *(int *)(ray + 0x88) |
                                   (uint)!bVar61 * auVar65._8_4_;
                              bVar61 = SUB81(uVar64 >> 3,0);
                              auVar110._12_4_ =
                                   (uint)bVar61 * *(int *)(ray + 0x8c) |
                                   (uint)!bVar61 * auVar65._12_4_;
                              *(undefined1 (*) [16])pRVar1 = auVar110;
                            }
                            uVar46 = (ulong)(((byte)uVar64 ^ 0xf) & bVar55);
                          }
                        }
                      }
                      bVar55 = (byte)uVar46;
                      if ((bVar55 == 0) || (bVar61 = 2 < uVar59, uVar59 = uVar59 + 1, bVar61))
                      break;
                    }
                    bVar43 = bVar43 & bVar55;
                    uVar45 = (ulong)bVar43;
                  } while ((bVar43 != 0) && (uVar49 = uVar49 + 1, uVar49 < uVar63 - 8));
                  bVar43 = bVar43 ^ 0xf;
                }
                bVar43 = (byte)local_19a8 | bVar43;
                local_19a8 = (uint)bVar43;
                if (bVar43 == 0xf) {
                  local_19a8._0_1_ = 0xf;
                  goto LAB_006a9e90;
                }
                auVar65 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar61 = (bool)(bVar43 >> 1 & 1);
                bVar6 = (bool)(bVar43 >> 2 & 1);
                bVar7 = (bool)(bVar43 >> 3 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar61 * auVar65._4_4_ | (uint)!bVar61 * tray.tfar.field_0.i[1];
                tray.tfar.field_0.i[0] =
                     (uint)(bVar43 & 1) * auVar65._0_4_ |
                     (uint)!(bool)(bVar43 & 1) * tray.tfar.field_0.i[0];
                tray.tfar.field_0.i[2] =
                     (uint)bVar6 * auVar65._8_4_ | (uint)!bVar6 * tray.tfar.field_0.i[2];
                tray.tfar.field_0.i[3] =
                     (uint)bVar7 * auVar65._12_4_ | (uint)!bVar7 * tray.tfar.field_0.i[3];
              }
              goto LAB_006a888b;
            }
            uVar10 = vcmpps_avx512vl(auVar123._0_16_,(undefined1  [16])tray.tfar.field_0,9);
            uVar63 = root.ptr & 0xfffffffffffffff0;
            sVar51 = 8;
            auVar65 = auVar192._0_16_;
            do {
              root.ptr = *(size_t *)(uVar63 + 0x20 + lVar48 * 2);
              if (root.ptr == 8) {
                auVar123 = ZEXT1664(auVar65);
                root.ptr = sVar51;
                break;
              }
              uVar58 = *(undefined4 *)(uVar63 + 0x90 + lVar48);
              auVar100._4_4_ = uVar58;
              auVar100._0_4_ = uVar58;
              auVar100._8_4_ = uVar58;
              auVar100._12_4_ = uVar58;
              auVar72 = *(undefined1 (*) [16])(ray + 0x70);
              uVar58 = *(undefined4 *)(uVar63 + 0x30 + lVar48);
              auVar66._4_4_ = uVar58;
              auVar66._0_4_ = uVar58;
              auVar66._8_4_ = uVar58;
              auVar66._12_4_ = uVar58;
              auVar66 = vfmadd213ps_avx512vl(auVar100,auVar72,auVar66);
              uVar58 = *(undefined4 *)(uVar63 + 0xb0 + lVar48);
              auVar92._4_4_ = uVar58;
              auVar92._0_4_ = uVar58;
              auVar92._8_4_ = uVar58;
              auVar92._12_4_ = uVar58;
              uVar58 = *(undefined4 *)(uVar63 + 0x50 + lVar48);
              auVar67._4_4_ = uVar58;
              auVar67._0_4_ = uVar58;
              auVar67._8_4_ = uVar58;
              auVar67._12_4_ = uVar58;
              auVar67 = vfmadd213ps_avx512vl(auVar92,auVar72,auVar67);
              uVar58 = *(undefined4 *)(uVar63 + 0xd0 + lVar48);
              auVar79._4_4_ = uVar58;
              auVar79._0_4_ = uVar58;
              auVar79._8_4_ = uVar58;
              auVar79._12_4_ = uVar58;
              uVar58 = *(undefined4 *)(uVar63 + 0x70 + lVar48);
              auVar68._4_4_ = uVar58;
              auVar68._0_4_ = uVar58;
              auVar68._8_4_ = uVar58;
              auVar68._12_4_ = uVar58;
              auVar68 = vfmadd213ps_avx512vl(auVar79,auVar72,auVar68);
              uVar58 = *(undefined4 *)(uVar63 + 0xa0 + lVar48);
              auVar81._4_4_ = uVar58;
              auVar81._0_4_ = uVar58;
              auVar81._8_4_ = uVar58;
              auVar81._12_4_ = uVar58;
              uVar58 = *(undefined4 *)(uVar63 + 0x40 + lVar48);
              auVar70._4_4_ = uVar58;
              auVar70._0_4_ = uVar58;
              auVar70._8_4_ = uVar58;
              auVar70._12_4_ = uVar58;
              auVar69 = vfmadd213ps_avx512vl(auVar81,auVar72,auVar70);
              uVar58 = *(undefined4 *)(uVar63 + 0xc0 + lVar48);
              auVar83._4_4_ = uVar58;
              auVar83._0_4_ = uVar58;
              auVar83._8_4_ = uVar58;
              auVar83._12_4_ = uVar58;
              uVar58 = *(undefined4 *)(uVar63 + 0x60 + lVar48);
              auVar71._4_4_ = uVar58;
              auVar71._0_4_ = uVar58;
              auVar71._8_4_ = uVar58;
              auVar71._12_4_ = uVar58;
              auVar70 = vfmadd213ps_avx512vl(auVar83,auVar72,auVar71);
              uVar58 = *(undefined4 *)(uVar63 + 0xe0 + lVar48);
              auVar85._4_4_ = uVar58;
              auVar85._0_4_ = uVar58;
              auVar85._8_4_ = uVar58;
              auVar85._12_4_ = uVar58;
              uVar58 = *(undefined4 *)(uVar63 + 0x80 + lVar48);
              auVar101._4_4_ = uVar58;
              auVar101._0_4_ = uVar58;
              auVar101._8_4_ = uVar58;
              auVar101._12_4_ = uVar58;
              auVar71 = vfmadd213ps_avx512vl(auVar85,auVar72,auVar101);
              auVar94._8_8_ = tray.org.field_0._8_8_;
              auVar94._0_8_ = tray.org.field_0._0_8_;
              auVar99._8_8_ = tray.org.field_0._24_8_;
              auVar99._0_8_ = tray.org.field_0._16_8_;
              in_ZMM9 = ZEXT1664(auVar99);
              auVar108._8_8_ = tray.org.field_0._40_8_;
              auVar108._0_8_ = tray.org.field_0._32_8_;
              auVar66 = vsubps_avx(auVar66,auVar94);
              auVar87._0_4_ = tray.rdir.field_0._0_4_ * auVar66._0_4_;
              auVar87._4_4_ = tray.rdir.field_0._4_4_ * auVar66._4_4_;
              auVar87._8_4_ = tray.rdir.field_0._8_4_ * auVar66._8_4_;
              auVar87._12_4_ = tray.rdir.field_0._12_4_ * auVar66._12_4_;
              auVar66 = vsubps_avx(auVar67,auVar99);
              auVar93._0_4_ = auVar66._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar93._4_4_ = auVar66._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar93._8_4_ = auVar66._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar93._12_4_ = auVar66._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar66 = vsubps_avx(auVar68,auVar108);
              auVar80._0_4_ = tray.rdir.field_0._32_4_ * auVar66._0_4_;
              auVar80._4_4_ = tray.rdir.field_0._36_4_ * auVar66._4_4_;
              auVar80._8_4_ = tray.rdir.field_0._40_4_ * auVar66._8_4_;
              auVar80._12_4_ = tray.rdir.field_0._44_4_ * auVar66._12_4_;
              auVar66 = vsubps_avx(auVar69,auVar94);
              auVar82._0_4_ = tray.rdir.field_0._0_4_ * auVar66._0_4_;
              auVar82._4_4_ = tray.rdir.field_0._4_4_ * auVar66._4_4_;
              auVar82._8_4_ = tray.rdir.field_0._8_4_ * auVar66._8_4_;
              auVar82._12_4_ = tray.rdir.field_0._12_4_ * auVar66._12_4_;
              auVar66 = vsubps_avx(auVar70,auVar99);
              auVar84._0_4_ = auVar66._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar84._4_4_ = auVar66._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar84._8_4_ = auVar66._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar84._12_4_ = auVar66._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar66 = vsubps_avx(auVar71,auVar108);
              auVar86._0_4_ = tray.rdir.field_0._32_4_ * auVar66._0_4_;
              auVar86._4_4_ = tray.rdir.field_0._36_4_ * auVar66._4_4_;
              auVar86._8_4_ = tray.rdir.field_0._40_4_ * auVar66._8_4_;
              auVar86._12_4_ = tray.rdir.field_0._44_4_ * auVar66._12_4_;
              auVar66 = vpminsd_avx(auVar87,auVar82);
              auVar67 = vpminsd_avx(auVar93,auVar84);
              auVar66 = vpmaxsd_avx(auVar66,auVar67);
              auVar67 = vpminsd_avx(auVar80,auVar86);
              in_ZMM8 = ZEXT1664(auVar67);
              auVar66 = vpmaxsd_avx(auVar66,auVar67);
              auVar68 = vmulps_avx512vl(auVar66,auVar193._0_16_);
              auVar66 = vpmaxsd_avx(auVar87,auVar82);
              auVar67 = vpmaxsd_avx(auVar93,auVar84);
              auVar67 = vpminsd_avx(auVar66,auVar67);
              auVar66 = vpmaxsd_avx(auVar80,auVar86);
              auVar66 = vpminsd_avx(auVar67,auVar66);
              auVar67 = vmulps_avx512vl(auVar66,auVar194._0_16_);
              auVar66 = vpmaxsd_avx(auVar68,(undefined1  [16])tray.tnear.field_0);
              auVar67 = vpminsd_avx(auVar67,(undefined1  [16])tray.tfar.field_0);
              uVar12 = vcmpps_avx512vl(auVar66,auVar67,2);
              bVar43 = (byte)uVar12;
              if ((uVar50 & 7) == 6) {
                uVar58 = *(undefined4 *)(uVar63 + 0x100 + lVar48);
                auVar88._4_4_ = uVar58;
                auVar88._0_4_ = uVar58;
                auVar88._8_4_ = uVar58;
                auVar88._12_4_ = uVar58;
                uVar12 = vcmpps_avx512vl(auVar72,auVar88,1);
                uVar58 = *(undefined4 *)(uVar63 + 0xf0 + lVar48);
                auVar89._4_4_ = uVar58;
                auVar89._0_4_ = uVar58;
                auVar89._8_4_ = uVar58;
                auVar89._12_4_ = uVar58;
                uVar13 = vcmpps_avx512vl(auVar72,auVar89,0xd);
                bVar43 = (byte)uVar12 & (byte)uVar13 & bVar43;
              }
              bVar43 = bVar43 & (byte)uVar10;
              if (bVar43 == 0) {
                auVar123 = ZEXT1664(auVar65);
                root.ptr = sVar51;
              }
              else {
                auVar66 = vblendmps_avx512vl(auVar192._0_16_,auVar68);
                bVar61 = (bool)(bVar43 >> 1 & 1);
                bVar6 = (bool)(bVar43 >> 2 & 1);
                bVar7 = (bool)(bVar43 >> 3 & 1);
                auVar123 = ZEXT1664(CONCAT412((uint)bVar7 * auVar66._12_4_ |
                                              (uint)!bVar7 * auVar72._12_4_,
                                              CONCAT48((uint)bVar6 * auVar66._8_4_ |
                                                       (uint)!bVar6 * auVar72._8_4_,
                                                       CONCAT44((uint)bVar61 * auVar66._4_4_ |
                                                                (uint)!bVar61 * auVar72._4_4_,
                                                                (uint)(bVar43 & 1) * auVar66._0_4_ |
                                                                (uint)!(bool)(bVar43 & 1) *
                                                                auVar72._0_4_))));
                if (sVar51 != 8) {
                  pNVar57->ptr = sVar51;
                  pNVar57 = pNVar57 + 1;
                  *(undefined1 (*) [16])paVar60->v = auVar65;
                  paVar60 = paVar60 + 1;
                }
              }
              auVar65 = auVar123._0_16_;
              lVar48 = lVar48 + 4;
              sVar51 = root.ptr;
            } while (lVar48 != 0);
            if (root.ptr == 8) goto LAB_006a8ae5;
            uVar10 = vcmpps_avx512vl((undefined1  [16])auVar123._0_16_,
                                     (undefined1  [16])tray.tfar.field_0,9);
          } while ((byte)uVar56 < (byte)POPCOUNT((int)uVar10));
          pNVar57->ptr = root.ptr;
          pNVar57 = pNVar57 + 1;
          *paVar60 = auVar123._0_16_;
          paVar60 = paVar60 + 1;
LAB_006a8ae5:
          iVar44 = 4;
        }
        else {
          do {
            sVar51 = 0;
            for (uVar45 = uVar63; (uVar45 & 1) == 0; uVar45 = uVar45 >> 1 | 0x8000000000000000) {
              sVar51 = sVar51 + 1;
            }
            in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
            in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar61 = occluded1(This,bvh,root,sVar51,&pre,ray,&tray,context);
            bVar43 = (byte)(1 << ((uint)sVar51 & 0x1f));
            if (!bVar61) {
              bVar43 = 0;
            }
            bVar43 = (byte)local_19a8 | bVar43;
            local_19a8 = (uint)bVar43;
            uVar63 = uVar63 - 1 & uVar63;
          } while (uVar63 != 0);
          iVar44 = 3;
          if (bVar43 != 0xf) {
            auVar65 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            tray.tfar.field_0.i[0] =
                 (uint)(bVar43 & 1) * auVar65._0_4_ |
                 (uint)!(bool)(bVar43 & 1) * tray.tfar.field_0.i[0];
            bVar61 = (bool)(bVar43 >> 1 & 1);
            tray.tfar.field_0.i[1] =
                 (uint)bVar61 * auVar65._4_4_ | (uint)!bVar61 * tray.tfar.field_0.i[1];
            bVar61 = (bool)(bVar43 >> 2 & 1);
            tray.tfar.field_0.i[2] =
                 (uint)bVar61 * auVar65._8_4_ | (uint)!bVar61 * tray.tfar.field_0.i[2];
            bVar61 = (bool)(bVar43 >> 3 & 1);
            tray.tfar.field_0.i[3] =
                 (uint)bVar61 * auVar65._12_4_ | (uint)!bVar61 * tray.tfar.field_0.i[3];
            iVar44 = 2;
          }
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar190 = ZEXT1664(auVar65);
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar191 = ZEXT1664(auVar65);
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar192 = ZEXT1664(auVar65);
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar193 = ZEXT1664(auVar65);
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar194 = ZEXT1664(auVar65);
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
          auVar189 = ZEXT1664(auVar65);
          auVar65 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar188 = ZEXT1664(auVar65);
          auVar123 = ZEXT1664((undefined1  [16])vVar2.field_0);
          if (uVar56 < (uint)POPCOUNT(uVar58)) goto LAB_006a88dc;
        }
        if (iVar44 == 3) {
LAB_006a9e90:
          local_19a8._0_1_ = (byte)local_19a8 & bVar62;
          bVar61 = (bool)((byte)local_19a8 >> 1 & 1);
          bVar6 = (bool)((byte)local_19a8 >> 2 & 1);
          *(uint *)pRVar1 =
               (uint)((byte)local_19a8 & 1) * -0x800000 |
               (uint)!(bool)((byte)local_19a8 & 1) * *(int *)pRVar1;
          *(uint *)(ray + 0x84) = (uint)bVar61 * -0x800000 | (uint)!bVar61 * *(int *)(ray + 0x84);
          *(uint *)(ray + 0x88) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x88);
          *(uint *)(ray + 0x8c) =
               (uint)((byte)local_19a8 >> 3) * -0x800000 |
               (uint)!(bool)((byte)local_19a8 >> 3) * *(int *)(ray + 0x8c);
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }